

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib659.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uStack_30;
  
  iVar1 = curl_global_init(3);
  uVar7 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                  ,0x26,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                  ,0x27);
    iVar1 = 0x7c;
  }
  else {
    lVar5 = curl_url();
    if (lVar5 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"problem init URL api.");
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      iVar2 = curl_url_set(lVar5,5,"www.example.com",0);
      if (((iVar2 == 0) && (iVar2 = curl_url_set(lVar5,1,"http",0), iVar2 == 0)) &&
         (iVar2 = curl_url_set(lVar5,6,"80",0), iVar2 == 0)) {
        iVar1 = curl_easy_setopt(lVar4,0x282a,lVar5);
        uVar7 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar4,0x29,1);
          uVar7 = _stderr;
          if (iVar1 == 0) {
            iVar1 = 0;
            iVar2 = curl_easy_setopt(lVar4,0x2714,URL);
            uVar7 = _stderr;
            if (iVar2 == 0) {
              iVar2 = curl_easy_perform(lVar4);
              uVar7 = _stderr;
              if (iVar2 == 0) goto LAB_00102359;
              uVar3 = curl_easy_strerror(iVar2);
              pcVar6 = "%s:%d curl_easy_perform() failed with code %d (%s)\n";
              uStack_30 = 0x40;
              iVar1 = iVar2;
            }
            else {
              uVar3 = curl_easy_strerror(iVar2);
              pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uStack_30 = 0x3a;
              iVar1 = iVar2;
            }
            curl_mfprintf(uVar7,pcVar6,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                          ,uStack_30,iVar1,uVar3);
            goto LAB_00102359;
          }
          uVar3 = curl_easy_strerror(iVar1);
          uStack_30 = 0x39;
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          uStack_30 = 0x38;
        }
        curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib659.c"
                      ,uStack_30,iVar1,uVar3);
      }
      else {
        curl_mfprintf(_stderr,"problem setting CURLUPART");
      }
    }
  }
LAB_00102359:
  curl_url_cleanup(lVar5);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLcode res = 0;
  CURLU *urlp = NULL;

  global_init(CURL_GLOBAL_ALL);
  easy_init(handle);

  urlp = curl_url();

  if(!urlp) {
    fprintf(stderr, "problem init URL api.");
    goto test_cleanup;
  }

  /* this doesn't set the PATH part */
  if(curl_url_set(urlp, CURLUPART_HOST, "www.example.com", 0) ||
     curl_url_set(urlp, CURLUPART_SCHEME, "http", 0) ||
     curl_url_set(urlp, CURLUPART_PORT, "80", 0)) {
    fprintf(stderr, "problem setting CURLUPART");
    goto test_cleanup;
  }

  easy_setopt(handle, CURLOPT_CURLU, urlp);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);
  easy_setopt(handle, CURLOPT_PROXY, URL);

  res = curl_easy_perform(handle);

  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

test_cleanup:

  curl_url_cleanup(urlp);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}